

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strtod.h
# Opt level: O2

int rapidjson::internal::CheckWithinHalfULP(double b,BigInteger *d,int dExp)

{
  int iVar1;
  BigInteger *pBVar2;
  uint exp;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  Double db;
  BigInteger dS;
  BigInteger delta;
  BigInteger hS;
  BigInteger bS;
  
  uVar7 = (ulong)b & 0xfffffffffffff;
  uVar8 = uVar7;
  if (uVar7 == 0) {
    uVar8 = uVar7 + 0x10000000000000;
  }
  if (((ulong)b & 0x7ff0000000000000) != 0) {
    uVar8 = uVar7 + 0x10000000000000;
  }
  db.field_0 = (anon_union_8_2_f9eca910_for_Double_7)b;
  iVar1 = Double::IntegerExponent(&db);
  exp = -dExp;
  if (dExp < 0) {
    dExp = 0;
  }
  else {
    exp = 0;
  }
  iVar4 = 0;
  if (-1 < iVar1) {
    iVar4 = iVar1;
  }
  iVar5 = iVar1;
  if (-1 < iVar1) {
    iVar5 = 0;
  }
  iVar6 = 0;
  iVar3 = iVar1 + -1;
  if (0 < iVar1) {
    iVar3 = 0;
    iVar6 = iVar1 + -1;
  }
  iVar6 = (exp - iVar5) + iVar6;
  iVar4 = (iVar4 + exp) - iVar3;
  iVar5 = dExp - (iVar3 + iVar5);
  iVar1 = iVar4;
  if (iVar5 < iVar4) {
    iVar1 = iVar5;
  }
  if (iVar6 <= iVar1) {
    iVar1 = iVar6;
  }
  dS.count_ = d->count_;
  memcpy(&dS,d,dS.count_ << 3);
  pBVar2 = BigInteger::MultiplyPow5(&dS,dExp);
  BigInteger::operator<<=(pBVar2,(ulong)(uint)(iVar5 - iVar1));
  bS.count_ = 1;
  bS.digits_[0] = uVar8;
  pBVar2 = BigInteger::MultiplyPow5(&bS,exp);
  BigInteger::operator<<=(pBVar2,(ulong)(uint)(iVar4 - iVar1));
  hS.count_ = 1;
  hS.digits_[0] = 1;
  pBVar2 = BigInteger::MultiplyPow5(&hS,exp);
  BigInteger::operator<<=(pBVar2,(ulong)(uint)(iVar6 - iVar1));
  delta.count_ = 1;
  delta.digits_[0] = 0;
  BigInteger::Difference(&dS,&bS,&delta);
  iVar1 = BigInteger::Compare(&delta,&hS);
  return iVar1;
}

Assistant:

inline int CheckWithinHalfULP(double b, const BigInteger& d, int dExp) {
    const Double db(b);
    const uint64_t bInt = db.IntegerSignificand();
    const int bExp = db.IntegerExponent();
    const int hExp = bExp - 1;

    int dS_Exp2 = 0, dS_Exp5 = 0, bS_Exp2 = 0, bS_Exp5 = 0, hS_Exp2 = 0, hS_Exp5 = 0;

    // Adjust for decimal exponent
    if (dExp >= 0) {
        dS_Exp2 += dExp;
        dS_Exp5 += dExp;
    }
    else {
        bS_Exp2 -= dExp;
        bS_Exp5 -= dExp;
        hS_Exp2 -= dExp;
        hS_Exp5 -= dExp;
    }

    // Adjust for binary exponent
    if (bExp >= 0)
        bS_Exp2 += bExp;
    else {
        dS_Exp2 -= bExp;
        hS_Exp2 -= bExp;
    }

    // Adjust for half ulp exponent
    if (hExp >= 0)
        hS_Exp2 += hExp;
    else {
        dS_Exp2 -= hExp;
        bS_Exp2 -= hExp;
    }

    // Remove common power of two factor from all three scaled values
    int common_Exp2 = Min3(dS_Exp2, bS_Exp2, hS_Exp2);
    dS_Exp2 -= common_Exp2;
    bS_Exp2 -= common_Exp2;
    hS_Exp2 -= common_Exp2;

    BigInteger dS = d;
    dS.MultiplyPow5(static_cast<unsigned>(dS_Exp5)) <<= static_cast<unsigned>(dS_Exp2);

    BigInteger bS(bInt);
    bS.MultiplyPow5(static_cast<unsigned>(bS_Exp5)) <<= static_cast<unsigned>(bS_Exp2);

    BigInteger hS(1);
    hS.MultiplyPow5(static_cast<unsigned>(hS_Exp5)) <<= static_cast<unsigned>(hS_Exp2);

    BigInteger delta(0);
    dS.Difference(bS, &delta);

    return delta.Compare(hS);
}